

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_boolean_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  JSValue JVar3;
  JSValue val;
  
  JVar3 = *argv;
  if (0xfffffff4 < (uint)argv->tag) {
    *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
  }
  iVar1 = JS_ToBoolFree(ctx,JVar3);
  JVar2._1_7_ = 0;
  JVar2.int32._0_1_ = iVar1 != 0;
  JVar3.tag = 1;
  JVar3.u.ptr = JVar2.ptr;
  if (((int)new_target.tag != 3) &&
     (JVar3 = js_create_from_ctor(ctx,new_target,6), (int)JVar3.tag != 6)) {
    val.tag = 1;
    val.u.ptr = JVar2.ptr;
    JS_SetObjectData(ctx,JVar3,val);
  }
  return JVar3;
}

Assistant:

static JSValue js_boolean_constructor(JSContext *ctx, JSValueConst new_target,
                                     int argc, JSValueConst *argv)
{
    JSValue val, obj;
    val = JS_NewBool(ctx, JS_ToBool(ctx, argv[0]));
    if (!JS_IsUndefined(new_target)) {
        obj = js_create_from_ctor(ctx, new_target, JS_CLASS_BOOLEAN);
        if (!JS_IsException(obj))
            JS_SetObjectData(ctx, obj, val);
        return obj;
    } else {
        return val;
    }
}